

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecFadds.c
# Opt level: O0

Gia_Man_t * Gia_ManGenerateExtraAig(int nBoxes,int nIns,int nOuts)

{
  int iVar1;
  Gia_Man_t *p;
  int local_a8 [2];
  int pOutLits [16];
  int pInLits [16];
  int k;
  int i;
  Gia_Man_t *pNew;
  int nOuts_local;
  int nIns_local;
  int nBoxes_local;
  
  p = Gia_ManStart(nBoxes * 0x14);
  if ((nIns < 0x10) && (nOuts < 0x10)) {
    for (pInLits[0xf] = 0; pInLits[0xf] < nIns; pInLits[0xf] = pInLits[0xf] + 1) {
      iVar1 = Gia_ManAppendCi(p);
      pOutLits[(long)pInLits[0xf] + 0xe] = iVar1;
    }
    iVar1 = Gia_ManAppendXor(p,pOutLits[0xe],pOutLits[0xf]);
    local_a8[0] = Gia_ManAppendXor(p,iVar1,pInLits[0]);
    local_a8[1] = Gia_ManAppendMaj(p,pOutLits[0xe],pOutLits[0xf],pInLits[0]);
    for (pInLits[0xf] = 0; pInLits[0xf] < nBoxes; pInLits[0xf] = pInLits[0xf] + 1) {
      for (pInLits[0xe] = 0; pInLits[0xe] < nOuts; pInLits[0xe] = pInLits[0xe] + 1) {
        Gia_ManAppendCo(p,local_a8[pInLits[0xe]]);
      }
    }
    return p;
  }
  __assert_fail("nIns < 16 && nOuts < 16",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acecFadds.c"
                ,0x2b5,"Gia_Man_t *Gia_ManGenerateExtraAig(int, int, int)");
}

Assistant:

Gia_Man_t * Gia_ManGenerateExtraAig( int nBoxes, int nIns, int nOuts )
{
    Gia_Man_t * pNew = Gia_ManStart( nBoxes * 20 );
    int i, k, pInLits[16], pOutLits[16];
    assert( nIns < 16 && nOuts < 16 );
    for ( i = 0; i < nIns; i++ )
        pInLits[i] = Gia_ManAppendCi( pNew );
    pOutLits[0] = Gia_ManAppendXor( pNew, Gia_ManAppendXor(pNew, pInLits[0], pInLits[1]), pInLits[2] );
    pOutLits[1] = Gia_ManAppendMaj( pNew, pInLits[0], pInLits[1], pInLits[2] );
    for ( i = 0; i < nBoxes; i++ )
        for ( k = 0; k < nOuts; k++ )
            Gia_ManAppendCo( pNew, pOutLits[k] );
    return pNew;
}